

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O1

void __thiscall
lts2::LBDOperator::updateRingCells
          (LBDOperator *this,IntegratingCell *cells,int numberOfCells,float detectorSize,
          float ringRadius,float omega,float phi)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  double *pdVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  long lVar7;
  
  if (0 < numberOfCells) {
    iVar1 = (this->_patchSize).width;
    iVar2 = (this->_patchSize).height;
    pdVar8 = &cells->scaleFactor;
    uVar9 = 0;
    do {
      fVar12 = (float)(int)uVar9 * omega + phi;
      fVar13 = cosf(fVar12);
      fVar13 = fVar13 * ringRadius + (float)(iVar1 / 2);
      fVar12 = sinf(fVar12);
      fVar12 = fVar12 * ringRadius + (float)(iVar2 / 2);
      lVar5 = lrintf(fVar13 - detectorSize);
      lVar6 = lrintf(fVar13 + detectorSize);
      lVar7 = lrintf(fVar12 - detectorSize);
      iVar3 = (int)lVar7;
      lVar7 = lrintf(fVar12 + detectorSize);
      iVar11 = (int)lVar5;
      if (iVar11 < 1) {
        iVar11 = 0;
      }
      iVar10 = (this->_patchSize).width;
      iVar4 = (this->_patchSize).height;
      if ((int)lVar6 < iVar10) {
        iVar10 = (int)lVar6 + 1;
      }
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      if ((int)lVar7 < iVar4) {
        iVar4 = (int)lVar7 + 1;
      }
      ((IntegratingCell *)(pdVar8 + -2))->xmin = iVar11;
      *(int *)((long)pdVar8 + -0xc) = iVar10;
      *(int *)(pdVar8 + -1) = iVar3;
      *(int *)((long)pdVar8 + -4) = iVar4;
      *pdVar8 = 1.0 / (double)((iVar4 - iVar3) * (iVar10 - iVar11));
      uVar9 = uVar9 + 1;
      pdVar8 = pdVar8 + 3;
    } while ((uint)numberOfCells != uVar9);
  }
  return;
}

Assistant:

void lts2::LBDOperator::updateRingCells(lbd::IntegratingCell* cells, int numberOfCells, float detectorSize, float ringRadius, float omega, float phi)
{
    float xoffset = _patchSize.width / 2;
    float yoffset = _patchSize.height / 2;
    
    for (int cellIdx = 0; cellIdx < numberOfCells; ++cellIdx)
    {
      lbd::IntegratingCell* currentCell = cells + cellIdx;
        
        float theta = cellIdx * omega + phi;
        
        float xc = xoffset + ringRadius * std::cos(theta);
        float yc = yoffset + ringRadius * std::sin(theta);
        
        int xmin =  (int)lrintf(xc-detectorSize);
        int xmax =  (int)lrintf(xc+detectorSize) + 1;
        int ymin =  (int)lrintf(yc-detectorSize);
        int ymax =  (int)lrintf(yc+detectorSize) + 1;
        
        xmin = MAX(xmin, 0);
        xmax = MIN(xmax, _patchSize.width);
        ymin = MAX(ymin, 0);
        ymax = MIN(ymax, _patchSize.height);
        
        currentCell->xmin = xmin;
        currentCell->xmax = xmax;
        currentCell->ymin = ymin;
        currentCell->ymax = ymax;
        
        double cellArea = double((xmax - xmin)*(ymax - ymin));
        currentCell->scaleFactor = 1.0 / cellArea;
    }
}